

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,Twine *message)

{
  string local_80;
  Twine local_60;
  undefined8 local_48;
  undefined4 local_40;
  char *local_38;
  size_t local_30;
  Twine *local_28;
  Twine *message_local;
  BuildSystemFrontendDelegate *this_local;
  char **local_10;
  
  local_10 = &local_38;
  this_local = (BuildSystemFrontendDelegate *)0x2df48a;
  local_38 = "";
  local_28 = message;
  message_local = (Twine *)this;
  local_30 = strlen("");
  local_48 = 0;
  local_40 = 0;
  llvm::Twine::str_abi_cxx11_(&local_80,local_28);
  llvm::Twine::Twine(&local_60,&local_80);
  (*(this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate[3])
            (this,local_38,local_30,&local_48,&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(const Twine& message) {
  error("", {}, message.str());
}